

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O3

void CB_EXPLORE_ADF::predict_or_learn_cover<true>
               (cb_explore_adf *data,multi_learner *base,multi_ex *examples)

{
  pointer *ppfVar1;
  label *this;
  float fVar2;
  float fVar3;
  pointer pfVar4;
  iterator __position;
  action_score *paVar5;
  undefined1 auVar6 [12];
  multi_ex *pmVar7;
  bool bVar8;
  long lVar9;
  ulong uVar10;
  size_t i;
  ulong uVar11;
  float *__args;
  example *peVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  undefined4 in_XMM2_Db;
  undefined1 local_e8 [16];
  undefined1 local_c8 [8];
  undefined8 local_c0;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  multi_ex *local_98;
  vector<float,std::allocator<float>> *local_90;
  float local_88;
  long local_78;
  example *local_70;
  v_array<COST_SENSITIVE::label> *local_68;
  v_array<CB::label> *local_60;
  undefined1 local_58 [16];
  pointer_____offset_0x10___ *local_40;
  action_score *local_38;
  
  if ((data->gen_cs).cb_type == 3) {
    GEN_CS::gen_cs_example_dr<true>(&data->gen_cs,examples,&data->cs_labels);
  }
  else {
    GEN_CS::gen_cs_example<false>(&data->gen_cs,examples,&data->cs_labels);
  }
  LEARNER::multiline_learn_or_predict<true>(base,examples,data->offset,0);
  peVar12 = *(examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  uVar15 = (long)(peVar12->pred).scalars._end - (long)(peVar12->pred).scalars._begin >> 3;
  local_b8 = (float)data->cover_size;
  uVar14 = (uint)uVar15;
  uVar15 = uVar15 & 0xffffffff;
  local_88 = (float)uVar15;
  lVar9 = data->counter * uVar15;
  auVar18._8_4_ = (int)((ulong)lVar9 >> 0x20);
  auVar18._0_8_ = lVar9;
  auVar18._12_4_ = 0x45300000;
  dVar17 = SQRT((auVar18._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0));
  auVar6._4_8_ = (ulong)dVar17 >> 0x20;
  auVar6._0_4_ = (float)dVar17;
  auVar19._0_8_ = auVar6._0_8_;
  auVar19._8_4_ = (int)((ulong)dVar17 >> 0x20);
  auVar19._12_4_ = in_XMM2_Db;
  local_e8._4_4_ = local_88;
  local_e8._0_4_ = (float)dVar17;
  local_e8._8_8_ = auVar19._8_8_;
  local_98 = examples;
  v_array<ACTION_SCORE::action_score>::clear(&data->action_probs);
  if (uVar14 != 0) {
    uVar13 = 0;
    do {
      local_c8._4_4_ = 0;
      local_c8._0_4_ = uVar13;
      v_array<ACTION_SCORE::action_score>::push_back(&data->action_probs,(action_score *)local_c8);
      uVar13 = uVar13 + 1;
    } while (uVar14 != uVar13);
  }
  pmVar7 = local_98;
  auVar21 = divps(_DAT_0027c140,local_e8);
  pfVar4 = (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar4) {
    (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_finish = pfVar4;
  }
  uStack_a0 = auVar21._4_4_;
  local_a8 = CONCAT44(uStack_a0,uStack_a0);
  local_90 = (vector<float,std::allocator<float>> *)&data->scores;
  uStack_9c = uStack_a0;
  if (uVar14 != 0) {
    lVar9 = 0;
    do {
      __args = (float *)((long)(peVar12->pred).scalars._begin + lVar9 + 4);
      __position._M_current =
           (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  (local_90,__position,__args);
      }
      else {
        *__position._M_current = *__args;
        ppfVar1 = &(data->scores).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppfVar1 = *ppfVar1 + 1;
      }
      lVar9 = lVar9 + 8;
    } while (uVar15 * 8 - lVar9 != 0);
  }
  fVar22 = 1.0 / local_b8;
  if ((float)local_a8 <= auVar21._0_4_) {
    auVar21._0_4_ = (float)local_a8;
  }
  if (data->first_only == false) {
    paVar5 = (peVar12->pred).a_s._begin;
    lVar9 = (long)(peVar12->pred).scalars._end - (long)paVar5;
    if (lVar9 != 0) {
      uVar11 = lVar9 >> 3;
      uVar10 = 1;
      uVar16 = uVar10;
      if (1 < uVar11) {
        do {
          uVar16 = uVar10;
          if ((paVar5[uVar10].score != paVar5->score) ||
             (NAN(paVar5[uVar10].score) || NAN(paVar5->score))) break;
          uVar10 = uVar10 + 1;
          uVar16 = uVar11;
        } while (uVar11 != uVar10);
      }
      uVar10 = 0;
      do {
        fVar20 = (peVar12->pred).scalars._begin[uVar10 * 2];
        paVar5 = (data->action_probs)._begin;
        paVar5[(uint)fVar20].score = paVar5[(uint)fVar20].score + fVar22 / (float)uVar16;
        uVar10 = uVar10 + 1;
      } while (uVar16 != uVar10);
    }
  }
  else {
    uVar13 = ((peVar12->pred).a_s._begin)->action;
    paVar5 = (data->action_probs)._begin;
    paVar5[uVar13].score = paVar5[uVar13].score + fVar22;
  }
  local_58 = ZEXT416((uint)fVar22);
  bVar8 = CB::ec_is_example_header
                    (*(pmVar7->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_start);
  local_e8._0_4_ = auVar21._0_4_;
  local_88 = local_88 * (float)local_e8._0_4_;
  if (1 < data->cover_size) {
    fVar22 = ((float)local_58._0_4_ - (float)local_e8._0_4_) + local_88;
    this = &data->cs_labels_2;
    local_60 = &data->cb_labels;
    local_68 = &data->prepped_cs_labels;
    local_78 = (ulong)bVar8 << 4;
    local_a8 = 1;
    uStack_b4 = local_58._4_4_;
    uStack_b0 = local_58._8_4_;
    uStack_ac = local_58._12_4_;
    local_70 = peVar12;
    do {
      local_b8 = fVar22;
      v_array<COST_SENSITIVE::wclass>::clear(&this->costs);
      if (bVar8) {
        v_array<COST_SENSITIVE::wclass>::push_back(&this->costs,(data->cs_labels).costs._begin);
      }
      if (uVar14 != 0) {
        uVar16 = 0;
        lVar9 = local_78;
        do {
          fVar22 = (data->action_probs)._begin[uVar16].score;
          fVar20 = (float)local_e8._0_4_;
          if ((float)local_e8._0_4_ <= fVar22) {
            fVar20 = fVar22;
          }
          local_c8._4_4_ = (float)uVar16;
          local_c8._0_4_ =
               *(float *)((long)&((data->cs_labels).costs._begin)->x + lVar9) -
               (data->psi * (float)local_e8._0_4_) / (fVar20 / local_b8);
          local_c0._0_4_ = 0.0;
          local_c0._4_4_ = 0.0;
          v_array<COST_SENSITIVE::wclass>::push_back(&this->costs,(wclass *)local_c8);
          uVar16 = uVar16 + 1;
          lVar9 = lVar9 + 0x10;
        } while (uVar15 != uVar16);
      }
      local_a8 = local_a8 + 1;
      GEN_CS::call_cs_ldf<true>
                (data->cs_ldf_learner,local_98,local_60,this,local_68,data->offset,local_a8);
      if (uVar14 != 0) {
        uVar16 = 0;
        do {
          *(float *)(*(long *)local_90 + uVar16 * 4) =
               (local_70->pred).a_s._begin[uVar16].score +
               *(float *)(*(long *)local_90 + uVar16 * 4);
          uVar16 = uVar16 + 1;
        } while (uVar15 != uVar16);
      }
      if (data->first_only == false) {
        paVar5 = (local_70->pred).a_s._begin;
        lVar9 = (long)(local_70->pred).scalars._end - (long)paVar5;
        fVar22 = local_b8;
        if (lVar9 != 0) {
          uVar11 = lVar9 >> 3;
          uVar10 = 1;
          uVar16 = uVar10;
          if (1 < uVar11) {
            do {
              uVar16 = uVar10;
              if ((paVar5[uVar10].score != paVar5->score) ||
                 (NAN(paVar5[uVar10].score) || NAN(paVar5->score))) break;
              uVar10 = uVar10 + 1;
              uVar16 = uVar11;
            } while (uVar11 != uVar10);
          }
          fVar20 = (float)local_58._0_4_ / (float)uVar16;
          uVar10 = 0;
          do {
            fVar3 = (local_70->pred).scalars._begin[uVar10 * 2];
            paVar5 = (data->action_probs)._begin;
            fVar2 = paVar5[(uint)fVar3].score;
            fVar23 = (fVar2 - (float)local_e8._0_4_) + fVar20;
            uVar11 = (ulong)fVar23;
            fVar22 = fVar22 + (float)(~-(uint)(fVar2 < (float)local_e8._0_4_) & (uint)fVar20 |
                                     (uint)(float)((long)(fVar23 - 9.223372e+18) &
                                                   (long)uVar11 >> 0x3f | uVar11) &
                                     -(uint)(fVar2 < (float)local_e8._0_4_));
            paVar5[(uint)fVar3].score = fVar20 + fVar2;
            uVar10 = uVar10 + 1;
          } while (uVar16 != uVar10);
        }
      }
      else {
        uVar13 = ((local_70->pred).a_s._begin)->action;
        paVar5 = (data->action_probs)._begin;
        fVar22 = paVar5[uVar13].score;
        fVar20 = (fVar22 - (float)local_e8._0_4_) + (float)local_58._0_4_;
        uVar16 = (ulong)fVar20;
        paVar5[uVar13].score = (float)local_58._0_4_ + fVar22;
        fVar22 = local_b8 +
                 (float)(~-(uint)(fVar22 < (float)local_e8._0_4_) & local_58._0_4_ |
                        (uint)(float)((long)(fVar20 - 9.223372e+18) & (long)uVar16 >> 0x3f | uVar16)
                        & -(uint)(fVar22 < (float)local_e8._0_4_));
      }
      peVar12 = local_70;
    } while (local_a8 < data->cover_size);
  }
  local_c0 = (data->action_probs)._begin;
  local_38 = (data->action_probs)._end;
  local_c8 = (undefined1  [8])
             &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_40 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>(data->nounif ^ 1);
  do_sort(data);
  if (uVar15 != 0) {
    uVar16 = 0;
    do {
      *(action_score *)((peVar12->pred).scalars._begin + uVar16 * 2) =
           (data->action_probs)._begin[uVar16];
      uVar16 = uVar16 + 1;
    } while (uVar15 != uVar16);
  }
  data->counter = data->counter + 1;
  return;
}

Assistant:

void predict_or_learn_cover(cb_explore_adf& data, multi_learner& base, multi_ex& examples)
{
  // Randomize over predictions from a base set of predictors
  // Use cost sensitive oracle to cover actions to form distribution.
  const bool is_mtr = data.gen_cs.cb_type == CB_TYPE_MTR;
  if (is_learn)
  {
    if (is_mtr)  // use DR estimates for non-ERM policies in MTR
      GEN_CS::gen_cs_example_dr<true>(data.gen_cs, examples, data.cs_labels);
    else
      GEN_CS::gen_cs_example<false>(data.gen_cs, examples, data.cs_labels);
    multiline_learn_or_predict<true>(base, examples, data.offset);
  }
  else
  {
    GEN_CS::gen_cs_example_ips(examples, data.cs_labels);
    multiline_learn_or_predict<false>(base, examples, data.offset);
  }

  v_array<action_score>& preds = examples[0]->pred.a_s;
  const uint32_t num_actions = (uint32_t)preds.size();

  float additive_probability = 1.f / (float)data.cover_size;
  const float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(data.counter * num_actions));
  v_array<action_score>& probs = data.action_probs;
  probs.clear();
  for (uint32_t i = 0; i < num_actions; i++) probs.push_back({i, 0.});
  data.scores.clear();
  for (uint32_t i = 0; i < num_actions; i++) data.scores.push_back(preds[i].score);

  if (!data.first_only)
  {
    size_t tied_actions = fill_tied(data, preds);
    for (size_t i = 0; i < tied_actions; ++i) probs[preds[i].action].score += additive_probability / tied_actions;
  }
  else
    probs[preds[0].action].score += additive_probability;

  const uint32_t shared = CB::ec_is_example_header(*examples[0]) ? 1 : 0;

  float norm = min_prob * num_actions + (additive_probability - min_prob);
  for (size_t i = 1; i < data.cover_size; i++)
  {
    // Create costs of each action based on online cover
    if (is_learn)
    {
      data.cs_labels_2.costs.clear();
      if (shared > 0)
        data.cs_labels_2.costs.push_back(data.cs_labels.costs[0]);
      for (uint32_t j = 0; j < num_actions; j++)
      {
        float pseudo_cost =
            data.cs_labels.costs[j + shared].x - data.psi * min_prob / (max(probs[j].score, min_prob) / norm);
        data.cs_labels_2.costs.push_back({pseudo_cost, j, 0., 0.});
      }
      GEN_CS::call_cs_ldf<true>(*(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels_2,
          data.prepped_cs_labels, data.offset, i + 1);
    }
    else
      GEN_CS::call_cs_ldf<false>(
          *(data.cs_ldf_learner), examples, data.cb_labels, data.cs_labels, data.prepped_cs_labels, data.offset, i + 1);

    for (uint32_t i = 0; i < num_actions; i++) data.scores[i] += preds[i].score;
    if (!data.first_only)
    {
      size_t tied_actions = fill_tied(data, preds);
      const float add_prob = additive_probability / tied_actions;
      for (size_t i = 0; i < tied_actions; ++i)
      {
        if (probs[preds[i].action].score < min_prob)
          norm += max(0, add_prob - (min_prob - probs[preds[i].action].score));
        else
          norm += add_prob;
        probs[preds[i].action].score += add_prob;
      }
    }
    else
    {
      uint32_t action = preds[0].action;
      if (probs[action].score < min_prob)
        norm += max(0, additive_probability - (min_prob - probs[action].score));
      else
        norm += additive_probability;
      probs[action].score += additive_probability;
    }
  }

  enforce_minimum_probability(min_prob * num_actions, !data.nounif, begin_scores(probs), end_scores(probs));

  do_sort(data);
  for (size_t i = 0; i < num_actions; i++) preds[i] = probs[i];

  ++data.counter;
}